

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatError.cpp
# Opt level: O1

ErrorHdr * __thiscall axl::xml::ExpatError::create(ExpatError *this,XML_Error code)

{
  ErrorHdr *pEVar1;
  ErrorHdr *pEVar2;
  
  pEVar1 = rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
                     ((Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef> *)this,
                      0x18,false);
  pEVar2 = (ErrorHdr *)0x0;
  if (pEVar1 != (ErrorHdr *)0x0) {
    pEVar1->m_size = 0x18;
    *(undefined8 *)&(pEVar1->m_guid).field_0 = 0x4ec164f7034b6d20;
    *(undefined8 *)((long)&(pEVar1->m_guid).field_0 + 8) = 0x65876c143fb25f8c;
    pEVar1->m_code = code;
    pEVar2 = pEVar1;
  }
  return pEVar2;
}

Assistant:

err::ErrorHdr*
ExpatError::create(XML_Error code) {
	err::ErrorHdr* error = createBuffer(sizeof(err::ErrorHdr));
	if (!error)
		return NULL;

	error->m_size = sizeof(err::ErrorHdr);
	error->m_guid = g_expatErrorGuid;
	error->m_code = code;
	return error;
}